

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

ARMVAParameters aa64_va_parameters_arm(CPUARMState *env,uint64_t va,ARMMMUIdx mmu_idx,_Bool data)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar12 = (ulong)mmu_idx;
  if (mmu_idx == ARMMMUIdx_Stage2) {
    uVar5 = (env->cp15).vtcr_el2.raw_tcr;
    bVar2 = (bool)((byte)(uVar5 >> 0xe) & 1);
    bVar13 = SUB81((uVar5 & 0xffff) >> 0xf,0);
    iVar10 = 0;
    uVar7 = 0;
    bVar6 = 0;
    uVar11 = 0;
    uVar9 = uVar5;
  }
  else {
    uVar3 = regime_el(env,mmu_idx);
    uVar5 = (env->cp15).tcr_el[uVar3].raw_tcr;
    uVar11 = (uint)(uVar5 >> 0x20);
    if ((mmu_idx < 0x23) && ((0x703ef0000U >> (uVar12 & 0x3f) & 1) != 0)) {
      if ((va >> 0x37 & 1) == 0) {
        bVar6 = (byte)((uVar5 & 0xffffffff) >> 7) & 1;
        bVar1 = (byte)(uVar5 >> 0xe);
        uVar7 = uVar11 >> 9;
        goto LAB_0058307e;
      }
      uVar7 = (uint)(uVar5 >> 0x1e) & 3;
      bVar13 = uVar7 == 1;
      bVar2 = uVar7 == 3;
      uVar9 = uVar5 >> 0x10 & 0xffff;
      bVar6 = (byte)(uVar5 >> 0x17) & 1;
      uVar7 = uVar11 >> 10;
      iVar10 = 1;
    }
    else {
      bVar1 = (byte)(uVar5 >> 0xe);
      uVar7 = (uint)(uVar5 >> 0x18);
      bVar6 = 0;
LAB_0058307e:
      bVar2 = (bool)(bVar1 & 1);
      bVar13 = SUB81((uVar5 & 0xffff) >> 0xf,0);
      iVar10 = 0;
      uVar9 = uVar5 & 0xffffffff;
    }
    uVar7 = uVar7 & 1;
    if (mmu_idx < 0x23) {
      if ((0x703ef0000U >> (uVar12 & 0x3f) & 1) == 0) {
        uVar11 = 0;
        if (uVar12 != 0x1b) goto LAB_00583174;
      }
      else {
        uVar11 = uVar11 >> 5 & 3;
      }
    }
    else {
LAB_00583174:
      uVar11 = ((uint)(uVar5 >> 0x14) & 1) * 3;
    }
  }
  if (data) goto LAB_00583103;
  if (mmu_idx < 0x23) {
    if ((0x703ef0000U >> (uVar12 & 0x3f) & 1) == 0) {
      uVar4 = 0;
      if (uVar12 != 0x1b) goto LAB_00583195;
    }
    else {
      uVar4 = (uint)(uVar5 >> 0x33);
    }
  }
  else {
LAB_00583195:
    uVar4 = ((uint)(uVar5 >> 0x1d) & 1) * 3;
  }
  uVar11 = uVar11 & ~uVar4;
LAB_00583103:
  uVar8 = (uint)uVar9 & 0x3f;
  uVar4 = 0x27;
  if (uVar8 < 0x27) {
    uVar4 = uVar8;
  }
  uVar8 = 0x10;
  if (0x10 < uVar4) {
    uVar8 = uVar4;
  }
  return (ARMVAParameters)
         ((uint)bVar2 << 0xd | iVar10 << 8 | uVar8 | (uint)bVar13 << 0xc | uVar7 << 0xb |
         (uint)bVar6 << 10 | (uint)((uVar11 >> iVar10 & 1) != 0) << 9);
}

Assistant:

ARMVAParameters aa64_va_parameters(CPUARMState *env, uint64_t va,
                                   ARMMMUIdx mmu_idx, bool data)
{
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    bool epd, hpd, using16k, using64k;
    int select, tsz, tbi;

    if (!regime_has_2_ranges(mmu_idx)) {
        select = 0;
        tsz = extract32(tcr, 0, 6);
        using64k = extract32(tcr, 14, 1);
        using16k = extract32(tcr, 15, 1);
        if (mmu_idx == ARMMMUIdx_Stage2) {
            /* VTCR_EL2 */
            hpd = false;
        } else {
            hpd = extract32(tcr, 24, 1);
        }
        epd = false;
    } else {
        /*
         * Bit 55 is always between the two regions, and is canonical for
         * determining if address tagging is enabled.
         */
        select = extract64(va, 55, 1);
        if (!select) {
            tsz = extract32(tcr, 0, 6);
            epd = extract32(tcr, 7, 1);
            using64k = extract32(tcr, 14, 1);
            using16k = extract32(tcr, 15, 1);
            hpd = extract64(tcr, 41, 1);
        } else {
            int tg = extract32(tcr, 30, 2);
            using16k = tg == 1;
            using64k = tg == 3;
            tsz = extract32(tcr, 16, 6);
            epd = extract32(tcr, 23, 1);
            hpd = extract64(tcr, 42, 1);
        }
    }
    tsz = MIN(tsz, 39);  /* TODO: ARMv8.4-TTST */
    tsz = MAX(tsz, 16);  /* TODO: ARMv8.2-LVA  */

    /* Present TBI as a composite with TBID.  */
    tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
    if (!data) {
        tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
    }
    tbi = (tbi >> select) & 1;

    return (ARMVAParameters) {
        .tsz = tsz,
        .select = select,
        .tbi = tbi,
        .epd = epd,
        .hpd = hpd,
        .using16k = using16k,
        .using64k = using64k,
    };
}